

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Fire_PDU::Fire_PDU
          (Fire_PDU *this,EntityIdentifier *FiringEntID,EntityIdentifier *TargetEntID,
          EntityIdentifier *MunitionID,EntityIdentifier *EventID,KUINT32 FireMissionIndex,
          WorldCoordinates *Location,DescPtr *Desc,Vector *Velocity,KFLOAT32 Range)

{
  KFLOAT64 KVar1;
  KFLOAT32 KVar2;
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> local_40;
  
  Warfare_Header::Warfare_Header
            (&this->super_Warfare_Header,FiringEntID,TargetEntID,MunitionID,EventID);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Fire_PDU_00224d58;
  this->m_ui32FireMissionIndex = FireMissionIndex;
  (this->m_Location).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00220d48;
  KVar1 = Location->m_f64Y;
  (this->m_Location).m_f64X = Location->m_f64X;
  (this->m_Location).m_f64Y = KVar1;
  (this->m_Location).m_f64Z = Location->m_f64Z;
  (this->m_pDescriptor)._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00224d28;
  (this->m_pDescriptor).m_pRef = (Descriptor *)0x0;
  (this->m_pDescriptor).m_piCount = (RefCounter *)0x0;
  (this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002216b8;
  KVar2 = Velocity->m_f32Y;
  (this->m_Velocity).m_f32X = Velocity->m_f32X;
  (this->m_Velocity).m_f32Y = KVar2;
  (this->m_Velocity).m_f32Z = Velocity->m_f32Z;
  this->m_f32Range = Range;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = '\x02';
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength = 0x60;
  local_40._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00224d28;
  local_40.m_pRef = Desc->m_pRef;
  local_40.m_piCount = Desc->m_piCount;
  if (local_40.m_pRef != (Descriptor *)0x0) {
    *local_40.m_piCount = *local_40.m_piCount + 1;
  }
  SetDescriptor(this,&local_40);
  local_40._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00224d28;
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::unRef(&local_40);
  return;
}

Assistant:

Fire_PDU::Fire_PDU( const EntityIdentifier & FiringEntID, const EntityIdentifier & TargetEntID, const EntityIdentifier & MunitionID,
                    const EntityIdentifier & EventID, KUINT32 FireMissionIndex, const WorldCoordinates & Location,
                    DescPtr Desc, const Vector & Velocity, KFLOAT32 Range ) :
    Warfare_Header( FiringEntID, TargetEntID, MunitionID, EventID ),
    m_ui32FireMissionIndex( FireMissionIndex ),
    m_Location( Location ),
    m_Velocity( Velocity ),
    m_f32Range( Range )
{
    m_ui8PDUType = Fire_PDU_Type;
    m_ui16PDULength = FIRE_PDU_SIZE;
    SetDescriptor( Desc );
}